

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

sockaddr_in mario::sockets::getPeerAddr(int sockfd)

{
  int iVar1;
  SA *__addr;
  Writer *this;
  Writer local_98;
  socklen_t local_20;
  int local_1c;
  socklen_t addrlen;
  int sockfd_local;
  sockaddr_in peeraddr;
  
  local_1c = sockfd;
  memset(&addrlen,0,0x10);
  iVar1 = local_1c;
  local_20 = 0x10;
  __addr = sockaddr_cast((sockaddr_in *)&addrlen);
  iVar1 = getpeername(iVar1,(sockaddr *)__addr,&local_20);
  if (iVar1 < 0) {
    el::base::Writer::Writer
              (&local_98,Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/SocketsOps.cpp"
               ,0x69,"struct sockaddr_in mario::sockets::getPeerAddr(int)",NormalLog,0);
    this = el::base::Writer::construct(&local_98,1,el::base::consts::kDefaultLoggerId);
    el::base::Writer::operator<<(this,(char (*) [21])"sockets::getPeerAddr");
    el::base::Writer::~Writer(&local_98);
  }
  return _addrlen;
}

Assistant:

struct sockaddr_in sockets::getPeerAddr(int sockfd) {
    struct sockaddr_in peeraddr;
    bzero(&peeraddr, sizeof(peeraddr));
    socklen_t addrlen = sizeof(peeraddr);
    if (::getpeername(sockfd, sockaddr_cast(&peeraddr), &addrlen) < 0) {
        LOG(FATAL) << "sockets::getPeerAddr";
    }
    return peeraddr;
}